

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_r4stat(fitsfile *infptr,int naxis,long *naxes,imgstats *imagestats,int *status)

{
  double *sigma_00;
  double *noise5_00;
  double *noise3_00;
  double *mean_00;
  double *noise2_00;
  float *maxvalue_00;
  int *in_RCX;
  long *in_RDX;
  int in_ESI;
  int *in_R8;
  double noise5;
  double noise3;
  double noise2;
  double noise1;
  double sigma;
  double mean;
  int checknull;
  int anynul;
  float nullvalue;
  float maxvalue;
  float minvalue;
  float *array;
  long ny;
  long nx;
  long ngood;
  long npix;
  long i2;
  long i1;
  long inc [9];
  float in_stack_0000012c;
  long lpixel [9];
  long fpixel [9];
  float *in_stack_fffffffffffffe38;
  long *in_stack_fffffffffffffe40;
  float in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  long in_stack_fffffffffffffe50;
  long in_stack_fffffffffffffe58;
  float *in_stack_fffffffffffffe60;
  float local_188;
  float local_184;
  double *in_stack_fffffffffffffe98;
  int *in_stack_fffffffffffffeb8;
  double *local_f8;
  double *local_f0;
  long local_e8;
  double *local_a8;
  double *local_a0;
  long local_98;
  int *local_58;
  int *local_50;
  long *local_48;
  int local_3c;
  int local_2c;
  
  local_58 = in_R8;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_3c = in_ESI;
  memcpy(&local_a8,&DAT_0026d010,0x48);
  memcpy(&local_f8,&DAT_0026d060,0x48);
  memcpy(&stack0xfffffffffffffeb8,&DAT_0026d0b0,0x48);
  local_a8 = (double *)(*local_48 / 2 - (long)(XSAMPLE / 2 + -1));
  local_f8 = (double *)(*local_48 / 2 + (long)(XSAMPLE / 2));
  if ((long)local_a8 < 1) {
    local_a8 = (double *)0x1;
  }
  if (*local_48 < (long)local_f8) {
    local_f8 = (double *)*local_48;
  }
  sigma_00 = (double *)((long)local_f8 + (1 - (long)local_a8));
  noise3_00 = local_f8;
  noise5_00 = local_a8;
  if (1 < local_3c) {
    noise5_00 = (double *)(local_48[1] / 2 - (long)(YSAMPLE / 2 + -1));
    noise3_00 = (double *)(local_48[1] / 2 + (long)(YSAMPLE / 2));
    if ((long)noise5_00 < 1) {
      noise5_00 = (double *)0x1;
    }
    local_f0 = noise3_00;
    local_a0 = noise5_00;
    if (local_48[1] < (long)noise3_00) {
      noise3_00 = (double *)local_48[1];
      local_f0 = noise3_00;
    }
  }
  mean_00 = (double *)((long)noise3_00 + (1 - (long)noise5_00));
  noise2_00 = (double *)((long)sigma_00 * (long)mean_00);
  if (2 < local_3c) {
    local_98 = local_48[2] / 2 + 1;
    local_e8 = local_48[2] / 2 + 1;
  }
  maxvalue_00 = (float *)calloc((size_t)noise2_00,4);
  if (maxvalue_00 == (float *)0x0) {
    *local_58 = 0x71;
    local_2c = *local_58;
  }
  else {
    ffgsve((fitsfile *)lpixel[4],lpixel[3]._4_4_,(int)lpixel[3],(long *)lpixel[2],(long *)lpixel[1],
           (long *)lpixel[0],(long *)fpixel[0],in_stack_0000012c,(float *)fpixel[1],(int *)fpixel[2]
           ,(int *)fpixel[3]);
    fits_img_stats_float
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe38,maxvalue_00,mean_00,sigma_00,in_stack_fffffffffffffe98,
               noise2_00,noise3_00,noise5_00,in_stack_fffffffffffffeb8);
    *local_50 = (int)noise2_00 - (int)in_stack_fffffffffffffe98;
    *(double *)(local_50 + 2) = (double)local_184;
    *(double *)(local_50 + 4) = (double)local_188;
    *(float **)(local_50 + 6) = in_stack_fffffffffffffe60;
    *(long *)(local_50 + 8) = in_stack_fffffffffffffe58;
    *(long *)(local_50 + 10) = in_stack_fffffffffffffe50;
    *(ulong *)(local_50 + 0xc) = CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
    *(long **)(local_50 + 0xe) = in_stack_fffffffffffffe40;
    *(float **)(local_50 + 0x10) = in_stack_fffffffffffffe38;
    free(maxvalue_00);
    local_2c = *local_58;
  }
  return local_2c;
}

Assistant:

int fp_r4stat(fitsfile *infptr, int naxis, long *naxes, imgstats *imagestats, int *status)
{
/*
    read the central XSAMPLE by YSAMPLE region of pixels in the int*2 image, 
    and then compute basic statistics: min, max, mean, sigma, mean diff, etc.
*/

	long fpixel[9] = {1,1,1,1,1,1,1,1,1};
	long lpixel[9] = {1,1,1,1,1,1,1,1,1};
	long inc[9]    = {1,1,1,1,1,1,1,1,1};
	long i1, i2, npix, ngood, nx, ny;
	float *array, minvalue, maxvalue, nullvalue = FLOATNULLVALUE;
	int anynul,checknull = 1;
	double mean, sigma, noise1, noise2, noise3, noise5;
	
         /* select the middle XSAMPLE by YSAMPLE area of the image */
	i1 = naxes[0]/2 - (XSAMPLE/2 - 1);
	i2 = naxes[0]/2 + (XSAMPLE/2);
	if (i1 < 1) i1 = 1;
	if (i2 > naxes[0]) i2 = naxes[0];
	fpixel[0] = i1;
	lpixel[0] = i2;
	nx = i2 - i1 +1;

        if (naxis > 1) {
	    i1 = naxes[1]/2 - (YSAMPLE/2 - 1);
	    i2 = naxes[1]/2 + (YSAMPLE/2);
	    if (i1 < 1) i1 = 1;
	    if (i2 > naxes[1]) i2 = naxes[1];
	    fpixel[1] = i1;
	    lpixel[1] = i2;
	}
	ny = i2 - i1 +1;

	npix = nx * ny;

        /* if there are higher dimensions, read the middle plane of the cube */
	if (naxis > 2) {
	    fpixel[2] = naxes[2]/2 + 1;
	    lpixel[2] = naxes[2]/2 + 1;
	}

	array = calloc(npix, sizeof(float));
	if (!array) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	fits_read_subset_flt(infptr, 0, naxis, naxes, fpixel, lpixel, inc,
	    nullvalue, array, &anynul, status);

	/* are there any null values in the array? */
	if (!anynul) {
	   nullvalue = 0.;
	   checknull = 0;
	}

	/* compute statistics of the image */

        fits_img_stats_float(array, nx, ny, checknull, nullvalue, 
	&ngood, &minvalue, &maxvalue, &mean, &sigma, &noise1, &noise2, &noise3, &noise5, status);

	imagestats->n_nulls = npix - ngood;
	imagestats->minval = minvalue;
	imagestats->maxval = maxvalue; 
	imagestats->mean = mean; 
	imagestats->sigma = sigma; 
	imagestats->noise1 = noise1; 
	imagestats->noise2 = noise2; 
	imagestats->noise3 = noise3; 
	imagestats->noise5 = noise5; 
    
	free(array);
	return(*status);
}